

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeCheckFk(Vdbe *p,int deferred)

{
  int in_ESI;
  Vdbe *in_RDI;
  sqlite3 *db;
  int local_4;
  
  if (((in_ESI == 0) || (in_RDI->db->nDeferredCons + in_RDI->db->nDeferredImmCons < 1)) &&
     ((in_ESI != 0 || (in_RDI->nFkConstraint < 1)))) {
    local_4 = 0;
  }
  else {
    in_RDI->rc = 0x313;
    in_RDI->errorAction = '\x02';
    sqlite3VdbeError(in_RDI,"FOREIGN KEY constraint failed");
    if ((in_RDI->prepFlags & 0x80) == 0) {
      local_4 = 1;
    }
    else {
      local_4 = 0x313;
    }
  }
  return local_4;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeCheckFk(Vdbe *p, int deferred){
  sqlite3 *db = p->db;
  if( (deferred && (db->nDeferredCons+db->nDeferredImmCons)>0)
   || (!deferred && p->nFkConstraint>0)
  ){
    p->rc = SQLITE_CONSTRAINT_FOREIGNKEY;
    p->errorAction = OE_Abort;
    sqlite3VdbeError(p, "FOREIGN KEY constraint failed");
    if( (p->prepFlags & SQLITE_PREPARE_SAVESQL)==0 ) return SQLITE_ERROR;
    return SQLITE_CONSTRAINT_FOREIGNKEY;
  }
  return SQLITE_OK;
}